

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-compress.c
# Opt level: O0

void KosinskiCompress(KosinskiCompressCallbacks *callbacks,cc_bool print_debug_messages)

{
  size_t sVar1;
  FILE *pFVar2;
  uint uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  bool bVar6;
  ulong local_b8;
  size_t local_a8;
  size_t ring_buffer_index;
  uint byte_1;
  size_t distance_1;
  size_t distance;
  size_t length;
  uchar *previous_data;
  uchar *current_data;
  size_t match_length;
  size_t backsearch_index;
  size_t longest_match_length;
  size_t longest_match_index;
  size_t max_match_distance;
  size_t i;
  ulong uStack_30;
  uint byte;
  size_t dummy_counter;
  size_t read_index;
  size_t write_index;
  cc_bool print_debug_messages_local;
  KosinskiCompressCallbacks *callbacks_local;
  
  read_index = 0;
  dummy_counter = 0;
  uStack_30 = 0;
  output_position = 0;
  match_buffer_index = 0;
  descriptor_bits_remaining = 0x10;
  while ((read_index < 0xfd &&
         (uVar3 = (*callbacks->read_byte)(callbacks->read_byte_user_data), uVar3 != 0xffffffff))) {
    ring_buffer[read_index] = (uchar)uVar3;
    read_index = read_index + 1;
  }
  memset(ring_buffer + read_index,0,0x20fc - read_index);
  for (; pFVar2 = _stderr, dummy_counter != read_index;
      dummy_counter = backsearch_index + dummy_counter) {
    if (dummy_counter < 0x1f03) {
      local_a8 = dummy_counter;
    }
    else {
      local_a8 = 0x1f03;
    }
    longest_match_length = 0;
    backsearch_index = 0;
    for (match_length = 1; match_length < local_a8 + 1; match_length = match_length + 1) {
      current_data = (uchar *)0x0;
      previous_data = ring_buffer + (dummy_counter & 0x1fff);
      length = (size_t)(ring_buffer + (dummy_counter - match_length & 0x1fff));
      while( true ) {
        bVar6 = false;
        if (current_data < (uchar *)0xfd) {
          bVar6 = *previous_data == *(uchar *)length;
          length = length + 1;
          previous_data = previous_data + 1;
        }
        if (!bVar6) break;
        current_data = current_data + 1;
      }
      if (backsearch_index < current_data) {
        longest_match_length = match_length;
        backsearch_index = (size_t)current_data;
      }
    }
    if (backsearch_index < read_index - dummy_counter) {
      local_b8 = backsearch_index;
    }
    else {
      local_b8 = read_index - dummy_counter;
    }
    backsearch_index = local_b8;
    if (0x9fff < uStack_30) {
      uStack_30 = uStack_30 % 0xa000;
      if (print_debug_messages != '\0') {
        uVar4 = GetOutputPosition();
        fprintf(pFVar2,"%lX - 0xA000 boundary flag: %lX\n",uVar4,dummy_counter);
      }
      PutDescriptorBit('\0',callbacks);
      PutDescriptorBit('\x01',callbacks);
      PutMatchByte('\0');
      PutMatchByte(0xf0);
      PutMatchByte('\x01');
    }
    pFVar2 = _stderr;
    if (((local_b8 < 2) || (5 < local_b8)) || (0xff < longest_match_length)) {
      if ((local_b8 < 3) || (9 < local_b8)) {
        if (local_b8 < 3) {
          if (print_debug_messages != '\0') {
            uVar4 = GetOutputPosition();
            fprintf(pFVar2,"%lX - Literal match found: %X at %lX\n",uVar4,
                    (ulong)ring_buffer[dummy_counter & 0x1fff],dummy_counter);
          }
          backsearch_index = 1;
          PutDescriptorBit('\x01',callbacks);
          PutMatchByte(ring_buffer[dummy_counter & 0x1fff]);
        }
        else {
          if (print_debug_messages != '\0') {
            uVar4 = GetOutputPosition();
            fprintf(pFVar2,"%lX - Extended full match found: %lX, %lX, %lX\n",uVar4,dummy_counter,
                    dummy_counter - longest_match_length,local_b8);
          }
          PutDescriptorBit('\0',callbacks);
          PutDescriptorBit('\x01',callbacks);
          PutMatchByte((uchar)-longest_match_length);
          PutMatchByte((byte)(-longest_match_length >> 5) & 0xf8);
          PutMatchByte((char)local_b8 + 0xff);
        }
      }
      else {
        if (print_debug_messages != '\0') {
          uVar4 = GetOutputPosition();
          fprintf(pFVar2,"%lX - Full match found: %lX, %lX, %lX\n",uVar4,dummy_counter,
                  dummy_counter - longest_match_length,local_b8);
        }
        PutDescriptorBit('\0',callbacks);
        PutDescriptorBit('\x01',callbacks);
        PutMatchByte((uchar)-longest_match_length);
        PutMatchByte((byte)(-longest_match_length >> 5) & 0xf8 | (char)local_b8 - 2U & 7);
      }
    }
    else {
      if (print_debug_messages != '\0') {
        uVar4 = GetOutputPosition();
        fprintf(pFVar2,"%lX - Inline dictionary match found: %lX, %lX, %lX\n",uVar4,dummy_counter,
                dummy_counter - longest_match_length,local_b8);
      }
      PutDescriptorBit('\0',callbacks);
      PutDescriptorBit('\0',callbacks);
      PutDescriptorBit((local_b8 - 2 & 2) != 0,callbacks);
      PutDescriptorBit((local_b8 - 2 & 1) != 0,callbacks);
      PutMatchByte(-(char)longest_match_length);
    }
    max_match_distance = 0;
    while ((max_match_distance < backsearch_index &&
           (uVar3 = (*callbacks->read_byte)(callbacks->read_byte_user_data), uVar3 != 0xffffffff)))
    {
      uVar5 = read_index & 0x1fff;
      ring_buffer[uVar5] = (uchar)uVar3;
      if (uVar5 < 0xfc) {
        ring_buffer[uVar5 + 0x2000] = (uchar)uVar3;
      }
      max_match_distance = max_match_distance + 1;
      read_index = read_index + 1;
    }
    uStack_30 = backsearch_index + uStack_30;
  }
  if (print_debug_messages != '\0') {
    uVar4 = GetOutputPosition();
    fprintf(pFVar2,"%lX - Terminator: %lX\n",uVar4,dummy_counter);
  }
  PutDescriptorBit('\0',callbacks);
  PutDescriptorBit('\x01',callbacks);
  PutMatchByte('\0');
  PutMatchByte(0xf0);
  PutMatchByte('\0');
  FlushData(callbacks);
  while( true ) {
    sVar1 = output_position;
    output_position = output_position + 1;
    if ((sVar1 & 0xf) == 0) break;
    (*callbacks->write_byte)(callbacks->write_byte_user_data,0);
  }
  return;
}

Assistant:

void KosinskiCompress(const KosinskiCompressCallbacks* const callbacks, const cc_bool print_debug_messages)
{
	size_t write_index = 0;
	size_t read_index = 0;
	size_t dummy_counter = 0;

	output_position = 0;
	match_buffer_index = 0;
	descriptor_bits_remaining = TOTAL_DESCRIPTOR_BITS;

	/* Initialise the ring buffer with data from the file */
	for (; write_index < MAX_MATCH_LENGTH; ++write_index)
	{
		const unsigned int byte = callbacks->read_byte((void*)callbacks->read_byte_user_data);

		if (byte == (unsigned int)-1)
			break;

		ring_buffer[write_index] = byte;
	}

	/* Fill the remainder of the ring buffer with zero. We know that
	   the original Kosinski compressor did this because of Mistake 6. */
	memset(&ring_buffer[write_index], 0, sizeof(ring_buffer) - write_index);

	while (read_index != write_index)
	{
		size_t i;

		const size_t max_match_distance = CC_MIN(read_index, MAX_MATCH_DISTANCE);

		/* Search backwards for previous occurances of the current data */
		size_t longest_match_index = 0;
		size_t longest_match_length = 0;
		size_t backsearch_index;
		for (backsearch_index = 1; backsearch_index < max_match_distance + 1; ++backsearch_index)
		{
			/* Mistake 6: `match_length` always counts up to `MAX_MATCH_LENGTH`, even if it means reading
			   past the end of the file. Because the ring buffer isn't updated once the end of the file is
			   reached, this results in leftover values from earlier in the file being read instead.
			   This bug causes the final match in the file to sometimes ignore suitable nearby data in
			   favour of data earlier in the file, even if it means using a larger match type. This is
			   because the chosen data just so happened to be followed by the same pattern of bytes that
			   the buggy search read from the ring buffer, while the nearby data did not. */
			size_t match_length = 0;
			const unsigned char *current_data = &ring_buffer[read_index % SLIDING_WINDOW_SIZE];
			const unsigned char *previous_data = &ring_buffer[(read_index - backsearch_index) % SLIDING_WINDOW_SIZE];
			while (match_length < MAX_MATCH_LENGTH && *current_data++ == *previous_data++)
				++match_length;

			if (match_length > longest_match_length)
			{
				longest_match_index = backsearch_index;
				longest_match_length = match_length;
			}
		}

		/* If the match is longer than the remainder of the file, reduce it to the proper size. See Mistake 6 for more info. */
		longest_match_length = CC_MIN(longest_match_length, write_index - read_index);

		/* Mistake 5: This is completely pointless.
		   For some reason, the original compressor would insert a dummy match
		   before the first match that starts after 0xA000.
		   Perhaps this was intended for detecting corrupted data? Maybe the PC
		   Kosinski decompressor would expect this type of match to appear every
		   0xA000 bytes, and if it didn't, then it would bail and print an error
		   message to the user telling them that the compressed data is corrupt. */
		if (dummy_counter >= 0xA000)
		{
			dummy_counter %= 0xA000;

			if (print_debug_messages)
				fprintf(stderr, "%lX - 0xA000 boundary flag: %lX\n", GetOutputPosition(), (unsigned long)read_index);

			/* 0xA000 boundary match */
			PutDescriptorBit(cc_false, callbacks);
			PutDescriptorBit(cc_true, callbacks);
			PutMatchByte(0x00);
			PutMatchByte(0xF0);	/* Honestly, I have no idea why this isn't just 0. I guess it's so you can spot it in a hex editor? */
			PutMatchByte(0x01);
		}

		/* Select the optimal encoding for the current match */
		if (longest_match_length >= 2 && longest_match_length <= 5 && longest_match_index < 0x100) /* Mistake 3: This should be '<= 0x100' */
		{
			/* Short distance, shortest length */
			const size_t length = longest_match_length - 2;

			if (print_debug_messages)
				fprintf(stderr, "%lX - Inline dictionary match found: %lX, %lX, %lX\n", GetOutputPosition(), (unsigned long)read_index, (unsigned long)(read_index - longest_match_index), (unsigned long)longest_match_length);

			PutDescriptorBit(cc_false, callbacks);
			PutDescriptorBit(cc_false, callbacks);
			PutDescriptorBit((length & 2) != 0, callbacks);
			PutDescriptorBit((length & 1) != 0, callbacks);
			PutMatchByte(-longest_match_index & 0xFF);
		}
		else if (longest_match_length >= 3 && longest_match_length <= 9)
		{
			/* Long distance, short length */
			const size_t distance = -longest_match_index;

			if (print_debug_messages)
				fprintf(stderr, "%lX - Full match found: %lX, %lX, %lX\n", GetOutputPosition(), (unsigned long)read_index, (unsigned long)(read_index - longest_match_index), (unsigned long)longest_match_length);

			PutDescriptorBit(cc_false, callbacks);
			PutDescriptorBit(cc_true, callbacks);
			PutMatchByte(distance & 0xFF);
			PutMatchByte(((distance >> (8 - 3)) & 0xF8) | ((longest_match_length - 2) & 7));
		}
		else if (longest_match_length >= 3)
		{
			/* Long distance, long length */
			const size_t distance = -longest_match_index;

			if (print_debug_messages)
				fprintf(stderr, "%lX - Extended full match found: %lX, %lX, %lX\n", GetOutputPosition(), (unsigned long)read_index, (unsigned long)(read_index - longest_match_index), (unsigned long)longest_match_length);

			PutDescriptorBit(cc_false, callbacks);
			PutDescriptorBit(cc_true, callbacks);
			PutMatchByte(distance & 0xFF);
			PutMatchByte((distance >> (8 - 3)) & 0xF8);
			PutMatchByte(longest_match_length - 1);
		}
		else
		{
			if (print_debug_messages)
				fprintf(stderr, "%lX - Literal match found: %X at %lX\n", GetOutputPosition(), ring_buffer[read_index % SLIDING_WINDOW_SIZE], (unsigned long)read_index);

			/* Match was too small to encode; do a literal match instead */
			longest_match_length = 1;

			PutDescriptorBit(cc_true, callbacks);
			PutMatchByte(ring_buffer[read_index % SLIDING_WINDOW_SIZE]);
		}

		/* Update the ring buffer with bytes from the file */
		for (i = 0; i < longest_match_length; ++i)
		{
			const unsigned int byte = callbacks->read_byte((void*)callbacks->read_byte_user_data);

			if (byte == (unsigned int)-1)
			{
				break;
			}
			else
			{
				const size_t ring_buffer_index = write_index++ % SLIDING_WINDOW_SIZE;

				ring_buffer[ring_buffer_index] = byte;

				/* Read into a little spill buffer, so that string comparisons
				   don't have to wrap back around to the start of the ring buffer */
				if (ring_buffer_index < MAX_MATCH_LENGTH - 1)
					ring_buffer[SLIDING_WINDOW_SIZE + ring_buffer_index] = byte;
			}
		}

		read_index += longest_match_length;
		dummy_counter += longest_match_length;
	}

	if (print_debug_messages)
		fprintf(stderr, "%lX - Terminator: %lX\n", GetOutputPosition(), (unsigned long)read_index);

	/* Terminator match */
	PutDescriptorBit(cc_false, callbacks);
	PutDescriptorBit(cc_true, callbacks);
	PutMatchByte(0x00);
	PutMatchByte(0xF0);	/* Honestly, I have no idea why this isn't just 0. I guess it's so you can spot it in a hex editor? */
	PutMatchByte(0x00);

	FlushData(callbacks);

	/* Mistake 4: There's absolutely no reason to do this.
	   This might have been because the original compressor's ASM output could
	   only write exactly 0x10 values per dc.b instruction. */

	/* Pad to 0x10 bytes */
	while (output_position++ % 0x10 != 0)
		callbacks->write_byte((void*)callbacks->write_byte_user_data, 0);
}